

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calendar.cpp
# Opt level: O2

UBool __thiscall icu_63::Calendar::operator==(Calendar *this,Calendar *that)

{
  int iVar1;
  double dVar2;
  UErrorCode status;
  UErrorCode local_24;
  double local_20;
  
  local_24 = U_ZERO_ERROR;
  iVar1 = (*(this->super_UObject)._vptr_UObject[5])();
  if ((char)iVar1 != '\0') {
    local_20 = getTimeInMillis(this,&local_24);
    dVar2 = getTimeInMillis(that,&local_24);
    if ((local_20 == dVar2) && (!NAN(local_20) && !NAN(dVar2))) {
      return local_24 < U_ILLEGAL_ARGUMENT_ERROR;
    }
  }
  return '\0';
}

Assistant:

UBool
Calendar::operator==(const Calendar& that) const
{
    UErrorCode status = U_ZERO_ERROR;
    return isEquivalentTo(that) &&
        getTimeInMillis(status) == that.getTimeInMillis(status) &&
        U_SUCCESS(status);
}